

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_b<ncnn::BinaryOp_x86_avx512_functor::binary_op_atan2>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  float __x;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  __m512 x;
  undefined1 auVar16 [64];
  __m512 y;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined8 uVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 (*pauVar79) [64];
  undefined1 auVar80 [16];
  int in_ECX;
  undefined1 (*in_RDX) [64];
  float *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  undefined1 auVar81 [32];
  float fVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  __m128 _outp_2;
  __m128 _p_2;
  __m256 _outp_1;
  __m256 _p_1;
  __m512 _outp;
  __m512 _p;
  __m512 _b_512;
  __m256 _b_256;
  __m128 _b_128;
  int i;
  float b;
  binary_op_atan2 op;
  __m256 special_result;
  __m256 negative_mask_full_x;
  __m256 normal_result;
  __m256 pi_additions;
  __m256 negative_mask_y;
  __m256 negative_mask_x;
  __m256 normal_mode;
  __m256 not_equal_zero_y;
  __m256 not_equal_zero_x;
  __m256 magic_half_pi;
  __m256 magic_pi;
  __m256 magic_negative_zero;
  __m256 magic_zero;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_a8;
  __m256 magic_a7;
  __m256 magic_a6;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_half_pi_1;
  __m256 magic_negative_one;
  __m256 magic_one;
  __m256 magic_negative_zero_1;
  __m128 special_result_1;
  __m128 negative_mask_full_x_1;
  __m128 normal_result_1;
  __m128 pi_additions_1;
  __m128 negative_mask_y_1;
  __m128 negative_mask_x_1;
  __m128 normal_mode_1;
  __m128 not_equal_zero_y_1;
  __m128 not_equal_zero_x_1;
  __m128 magic_half_pi_2;
  __m128 magic_pi_1;
  __m128 magic_negative_zero_2;
  __m128 magic_zero_1;
  __m128 output_approx_1;
  __m128 fourth_power_of_input_approx_1;
  __m128 square_of_input_approx_1;
  __m128 input_approx_1;
  __m128 is_small_input_1;
  __m128 absolute_1;
  __m128 negative_mask_1;
  __m128 magic_a8_1;
  __m128 magic_a7_1;
  __m128 magic_a6_1;
  __m128 magic_a5_1;
  __m128 magic_a4_1;
  __m128 magic_a3_1;
  __m128 magic_a2_1;
  __m128 magic_a1_1;
  __m128 magic_a0_1;
  __m128 magic_half_pi_3;
  __m128 magic_negative_one_1;
  __m128 magic_one_1;
  __m128 magic_negative_zero_3;
  undefined8 local_25f0;
  undefined8 uStackY_25e8;
  undefined8 local_25e0;
  undefined8 uStackY_25d8;
  undefined8 local_25c0;
  undefined8 uStackY_25b8;
  undefined8 uStackY_25b0;
  undefined8 uStackY_25a8;
  int local_247c;
  undefined1 (*local_2468) [64];
  undefined1 (*local_2458) [32];
  float *in_stack_ffffffffffffdbb8;
  undefined8 in_stack_ffffffffffffdbc0;
  undefined8 in_stack_ffffffffffffdbc8;
  undefined8 in_stack_ffffffffffffdbd0;
  undefined8 in_stack_ffffffffffffdbd8;
  undefined8 in_stack_ffffffffffffdbe0;
  undefined8 in_stack_ffffffffffffdbe8;
  undefined8 in_stack_ffffffffffffdbf0;
  undefined8 in_stack_ffffffffffffdbf8;
  undefined8 in_stack_ffffffffffffdc00;
  undefined1 (*in_stack_ffffffffffffdc08) [64];
  undefined8 in_stack_ffffffffffffdc10;
  float *in_stack_ffffffffffffdc18;
  undefined8 in_stack_ffffffffffffdc20;
  undefined8 in_stack_ffffffffffffdc28;
  undefined8 in_stack_ffffffffffffdc30;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  float local_20e0;
  float fStack_20dc;
  float fStack_20d8;
  float fStack_20d4;
  float fStack_20d0;
  float fStack_20cc;
  float fStack_20c8;
  float fStack_20c4;
  float local_20c0;
  float fStack_20bc;
  float fStack_20b8;
  float fStack_20b4;
  float fStack_20b0;
  float fStack_20ac;
  float fStack_20a8;
  float fStack_20a4;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined1 local_1bc0 [32];
  undefined1 local_1ba0 [32];
  undefined1 local_1b80 [32];
  undefined1 local_1b60 [32];
  undefined1 local_1b40 [32];
  undefined1 local_1b20 [32];
  undefined1 local_1b00 [32];
  undefined1 local_1ae0 [32];
  float local_1ac0;
  float fStack_1abc;
  float fStack_1ab8;
  float fStack_1ab4;
  float fStack_1ab0;
  float fStack_1aac;
  float fStack_1aa8;
  float fStack_1aa4;
  float local_1aa0;
  float fStack_1a9c;
  float fStack_1a98;
  float fStack_1a94;
  float fStack_1a90;
  float fStack_1a8c;
  float fStack_1a88;
  float fStack_1a84;
  undefined1 local_1a80 [32];
  undefined1 local_1a60 [32];
  undefined1 local_1a40 [32];
  undefined1 local_1a20 [32];
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined1 local_1860 [32];
  undefined1 local_1840 [8];
  float fStack_1838;
  float fStack_1834;
  float fStack_1830;
  float fStack_182c;
  float fStack_1828;
  float fStack_1824;
  float local_1820;
  float fStack_181c;
  float fStack_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float fStack_1808;
  float fStack_1804;
  undefined4 local_17f4;
  undefined4 local_17f0;
  undefined4 local_17ec;
  undefined4 local_17e8;
  undefined4 local_17e4;
  undefined4 local_17e0;
  undefined4 local_17dc;
  undefined4 local_17d8;
  undefined4 local_17d4;
  undefined4 local_17d0;
  undefined4 local_17cc;
  undefined4 local_17c8;
  undefined4 local_17c4;
  undefined1 local_17c0 [16];
  undefined1 auStack_17b0 [16];
  undefined4 local_17a0;
  undefined4 local_179c;
  undefined4 local_1798;
  undefined4 local_1794;
  undefined4 local_1790;
  undefined4 local_178c;
  undefined4 local_1788;
  undefined4 local_1784;
  undefined1 local_1780 [16];
  undefined1 auStack_1770 [16];
  undefined4 local_1760;
  undefined4 local_175c;
  undefined4 local_1758;
  undefined4 local_1754;
  undefined4 local_1750;
  undefined4 local_174c;
  undefined4 local_1748;
  undefined4 local_1744;
  undefined1 local_1740 [16];
  undefined1 auStack_1730 [16];
  undefined4 local_1720;
  undefined4 local_171c;
  undefined4 local_1718;
  undefined4 local_1714;
  undefined4 local_1710;
  undefined4 local_170c;
  undefined4 local_1708;
  undefined4 local_1704;
  undefined1 local_1700 [16];
  undefined1 auStack_16f0 [16];
  undefined4 local_16e0;
  undefined4 local_16dc;
  undefined4 local_16d8;
  undefined4 local_16d4;
  undefined4 local_16d0;
  undefined4 local_16cc;
  undefined4 local_16c8;
  undefined4 local_16c4;
  undefined1 local_16c0 [16];
  undefined1 auStack_16b0 [16];
  undefined4 local_16a0;
  undefined4 local_169c;
  undefined4 local_1698;
  undefined4 local_1694;
  undefined4 local_1690;
  undefined4 local_168c;
  undefined4 local_1688;
  undefined4 local_1684;
  undefined1 local_1680 [16];
  undefined1 auStack_1670 [16];
  undefined4 local_1660;
  undefined4 local_165c;
  undefined4 local_1658;
  undefined4 local_1654;
  undefined4 local_1650;
  undefined4 local_164c;
  undefined4 local_1648;
  undefined4 local_1644;
  undefined1 local_1640 [16];
  undefined1 auStack_1630 [16];
  undefined4 local_1620;
  undefined4 local_161c;
  undefined4 local_1618;
  undefined4 local_1614;
  undefined4 local_1610;
  undefined4 local_160c;
  undefined4 local_1608;
  undefined4 local_1604;
  undefined1 local_1600 [16];
  undefined1 auStack_15f0 [16];
  undefined4 local_15e0;
  undefined4 local_15dc;
  undefined4 local_15d8;
  undefined4 local_15d4;
  undefined4 local_15d0;
  undefined4 local_15cc;
  undefined4 local_15c8;
  undefined4 local_15c4;
  undefined1 local_15c0 [16];
  undefined1 auStack_15b0 [16];
  undefined4 local_15a0;
  undefined4 local_159c;
  undefined4 local_1598;
  undefined4 local_1594;
  undefined4 local_1590;
  undefined4 local_158c;
  undefined4 local_1588;
  undefined4 local_1584;
  undefined1 local_1580 [16];
  undefined1 auStack_1570 [16];
  undefined4 local_1560;
  undefined4 local_155c;
  undefined4 local_1558;
  undefined4 local_1554;
  undefined4 local_1550;
  undefined4 local_154c;
  undefined4 local_1548;
  undefined4 local_1544;
  undefined1 local_1540 [16];
  undefined1 auStack_1530 [16];
  undefined4 local_1520;
  undefined4 local_151c;
  undefined4 local_1518;
  undefined4 local_1514;
  undefined4 local_1510;
  undefined4 local_150c;
  undefined4 local_1508;
  undefined4 local_1504;
  undefined1 local_1500 [16];
  undefined1 auStack_14f0 [16];
  undefined4 local_14e0;
  undefined4 local_14dc;
  undefined4 local_14d8;
  undefined4 local_14d4;
  undefined4 local_14d0;
  undefined4 local_14cc;
  undefined4 local_14c8;
  undefined4 local_14c4;
  undefined1 local_14c0 [16];
  undefined1 auStack_14b0 [16];
  undefined4 local_14a0;
  undefined4 local_149c;
  undefined4 local_1498;
  undefined4 local_1494;
  undefined4 local_1490;
  undefined4 local_148c;
  undefined4 local_1488;
  undefined4 local_1484;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 *local_1380;
  undefined1 *local_1378;
  float *local_1370;
  undefined8 *local_1368;
  undefined1 *local_1360;
  float *local_1358;
  undefined8 *local_1350;
  undefined1 *local_1348;
  float *local_1340;
  undefined8 *local_1338;
  undefined1 *local_1330;
  float *local_1328;
  undefined8 *local_1320;
  undefined8 *local_1318;
  float *local_1310;
  undefined8 *local_1308;
  undefined1 *local_1300;
  float *local_12f8;
  undefined8 *local_12f0;
  undefined1 *local_12e8;
  float *local_12e0;
  undefined8 *local_12d8;
  undefined8 *local_12d0;
  float *local_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  float local_ea0;
  float fStack_e9c;
  float fStack_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  float fStack_e88;
  float fStack_e84;
  undefined1 local_e80 [32];
  undefined1 local_e60 [32];
  undefined1 local_e40 [32];
  undefined1 local_e20 [32];
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined1 local_d00 [32];
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined1 local_c80 [16];
  undefined1 local_c70 [16];
  float local_c60;
  float fStack_c5c;
  float fStack_c58;
  float fStack_c54;
  undefined1 local_c50 [16];
  undefined1 local_c40 [16];
  undefined1 local_c30 [16];
  undefined1 local_c20 [16];
  undefined1 local_c10 [16];
  undefined1 local_c00 [16];
  undefined8 local_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 local_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 local_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 local_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined1 local_b10 [16];
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined1 local_af0 [16];
  undefined1 local_ae0 [16];
  undefined8 local_ad0;
  undefined8 uStack_ac8;
  undefined1 local_ac0 [16];
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 local_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined1 local_9a0 [16];
  undefined8 local_990;
  undefined8 uStack_988;
  undefined1 local_980 [16];
  undefined8 local_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined4 local_924;
  undefined4 local_920;
  undefined4 uStack_91c;
  undefined4 uStack_918;
  undefined4 uStack_914;
  undefined4 local_908;
  undefined4 local_904;
  undefined4 local_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  undefined4 local_8e8;
  undefined4 local_8e4;
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined4 local_8c8;
  undefined4 local_8c4;
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 local_8a4;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  undefined1 local_840 [16];
  undefined1 local_830 [16];
  undefined1 local_820 [16];
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  float local_7e0;
  float fStack_7dc;
  float fStack_7d8;
  float fStack_7d4;
  float local_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float local_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined1 *local_580;
  undefined1 *local_578;
  float *local_570;
  undefined8 *local_568;
  undefined1 *local_560;
  float *local_558;
  undefined8 *local_550;
  undefined1 *local_548;
  float *local_540;
  undefined8 *local_538;
  undefined1 *local_530;
  float *local_528;
  undefined8 *local_520;
  undefined8 *local_518;
  float *local_510;
  undefined8 *local_508;
  undefined1 *local_500;
  float *local_4f8;
  undefined8 *local_4f0;
  undefined1 *local_4e8;
  float *local_4e0;
  undefined8 *local_4d8;
  undefined8 *local_4d0;
  float *local_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  float local_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined4 local_2b4;
  undefined4 local_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined4 local_298;
  undefined4 local_294;
  undefined4 local_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined4 local_278;
  undefined4 local_274;
  undefined4 local_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined4 local_238;
  undefined4 local_234;
  undefined4 local_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 local_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 local_114;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 local_90 [16];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  
  __x = *in_RSI;
  local_247c = 0;
  if (in_R8D == 4) {
    local_25f0 = *(undefined8 *)in_RSI;
    uStackY_25e8 = *(undefined8 *)(in_RSI + 2);
  }
  else {
    local_25f0 = CONCAT44(__x,__x);
    uStackY_25e8 = CONCAT44(__x,__x);
  }
  uVar37 = local_25f0;
  if (in_R8D == 8) {
    in_stack_ffffffffffffdc18 = in_RSI;
    uVar37 = *(undefined8 *)in_RSI;
  }
  pauVar79 = in_RDX;
  local_2458 = in_RDI;
  if (in_R8D != 0x10) {
    auVar1._8_8_ = uVar37;
    auVar1._0_8_ = uVar37;
    auVar1._16_8_ = uVar37;
    auVar1._24_8_ = uVar37;
    vinsertf64x4_avx512f
              (ZEXT3264(CONCAT824(uVar37,CONCAT816(uVar37,CONCAT88(uVar37,uVar37)))),auVar1,1);
    pauVar79 = in_RDX;
    in_RSI = in_stack_ffffffffffffdbb8;
  }
  for (; local_2468 = pauVar79, local_247c + 0xf < in_ECX; local_247c = local_247c + 0x10) {
    uVar83 = *(undefined8 *)*local_2458;
    uVar84 = *(undefined8 *)(*local_2458 + 8);
    uVar85 = *(undefined8 *)(*local_2458 + 0x10);
    uVar86 = *(undefined8 *)(*local_2458 + 0x18);
    uVar87 = *(undefined8 *)local_2458[1];
    uVar88 = *(undefined8 *)(local_2458[1] + 8);
    uVar89 = *(undefined8 *)(local_2458[1] + 0x10);
    uVar90 = *(undefined8 *)(local_2458[1] + 0x18);
    y[2] = (float)(int)in_stack_ffffffffffffdc00;
    y[3] = (float)(int)((ulong)in_stack_ffffffffffffdc00 >> 0x20);
    y[0] = (float)(int)in_stack_ffffffffffffdbf8;
    y[1] = (float)(int)((ulong)in_stack_ffffffffffffdbf8 >> 0x20);
    y._16_8_ = in_stack_ffffffffffffdc08;
    y[6] = (float)(int)in_stack_ffffffffffffdc10;
    y[7] = (float)(int)((ulong)in_stack_ffffffffffffdc10 >> 0x20);
    y._32_8_ = in_stack_ffffffffffffdc18;
    y[10] = (float)(int)in_stack_ffffffffffffdc20;
    y[0xb] = (float)(int)((ulong)in_stack_ffffffffffffdc20 >> 0x20);
    y[0xc] = (float)(int)in_stack_ffffffffffffdc28;
    y[0xd] = (float)(int)((ulong)in_stack_ffffffffffffdc28 >> 0x20);
    y[0xe] = (float)(int)in_stack_ffffffffffffdc30;
    y[0xf] = (float)(int)((ulong)in_stack_ffffffffffffdc30 >> 0x20);
    x[2] = (float)(int)in_stack_ffffffffffffdbc0;
    x[3] = (float)(int)((ulong)in_stack_ffffffffffffdbc0 >> 0x20);
    x._0_8_ = in_RSI;
    x[4] = (float)(int)in_stack_ffffffffffffdbc8;
    x[5] = (float)(int)((ulong)in_stack_ffffffffffffdbc8 >> 0x20);
    x[6] = (float)(int)in_stack_ffffffffffffdbd0;
    x[7] = (float)(int)((ulong)in_stack_ffffffffffffdbd0 >> 0x20);
    x[8] = (float)(int)in_stack_ffffffffffffdbd8;
    x[9] = (float)(int)((ulong)in_stack_ffffffffffffdbd8 >> 0x20);
    x[10] = (float)(int)in_stack_ffffffffffffdbe0;
    x[0xb] = (float)(int)((ulong)in_stack_ffffffffffffdbe0 >> 0x20);
    x[0xc] = (float)(int)in_stack_ffffffffffffdbe8;
    x[0xd] = (float)(int)((ulong)in_stack_ffffffffffffdbe8 >> 0x20);
    x[0xe] = (float)(int)in_stack_ffffffffffffdbf0;
    x[0xf] = (float)(int)((ulong)in_stack_ffffffffffffdbf0 >> 0x20);
    atan2512_ps(y,x);
    auVar16._8_8_ = uVar84;
    auVar16._0_8_ = uVar83;
    auVar16._16_8_ = uVar85;
    auVar16._24_8_ = uVar86;
    auVar16._32_8_ = uVar87;
    auVar16._40_8_ = uVar88;
    auVar16._48_8_ = uVar89;
    auVar16._56_8_ = uVar90;
    *local_2468 = auVar16;
    local_2458 = local_2458 + 2;
    pauVar79 = local_2468 + 1;
    in_stack_ffffffffffffdbc0 = uVar83;
    in_stack_ffffffffffffdbc8 = uVar84;
    in_stack_ffffffffffffdbd0 = uVar85;
    in_stack_ffffffffffffdbd8 = uVar86;
    in_stack_ffffffffffffdbe0 = uVar87;
    in_stack_ffffffffffffdbe8 = uVar88;
    in_stack_ffffffffffffdbf0 = uVar89;
    in_stack_ffffffffffffdbf8 = uVar90;
    in_stack_ffffffffffffdc08 = local_2468;
  }
  for (; local_247c + 7 < in_ECX; local_247c = local_247c + 8) {
    auVar40._8_8_ = uVar37;
    auVar40._0_8_ = uVar37;
    auVar40._16_8_ = uVar37;
    auVar40._24_8_ = uVar37;
    auVar39._8_8_ = uVar37;
    auVar39._0_8_ = uVar37;
    auVar39._16_8_ = uVar37;
    auVar39._24_8_ = uVar37;
    auVar38._8_8_ = uVar37;
    auVar38._0_8_ = uVar37;
    auVar38._16_8_ = uVar37;
    auVar38._24_8_ = uVar37;
    auVar7._8_8_ = uVar37;
    auVar7._0_8_ = uVar37;
    auVar7._16_8_ = uVar37;
    auVar7._24_8_ = uVar37;
    auVar80 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar80 = vinsertps_avx(auVar80,ZEXT416(0),0x20);
    auVar80 = vinsertps_avx(auVar80,ZEXT416(0),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x20);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x30);
    local_2080 = auVar80._0_8_;
    uStack_2078 = auVar80._8_8_;
    uStack_2070 = auVar3._0_8_;
    uStack_2068 = auVar3._8_8_;
    auVar3 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x20);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x30);
    auVar4 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x80000000),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x80000000),0x30);
    uStack_2030 = auVar4._0_8_;
    uStack_2028 = auVar4._8_8_;
    auVar4 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x40490fdb),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x40490fdb),0x30);
    auVar5 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
    auVar5 = vinsertps_avx(auVar5,ZEXT416(0x40490fdb),0x20);
    auVar5 = vinsertps_avx(auVar5,ZEXT416(0x40490fdb),0x30);
    uStack_1ff0 = auVar5._0_8_;
    uStack_1fe8 = auVar5._8_8_;
    auVar5 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3fc90fdb),0x20);
    auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3fc90fdb),0x30);
    auVar6 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3fc90fdb),0x20);
    auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3fc90fdb),0x30);
    uStack_1fb0 = auVar6._0_8_;
    uStack_1fa8 = auVar6._8_8_;
    auVar2._16_8_ = uStack_2070;
    auVar2._0_16_ = auVar80;
    auVar2._24_8_ = uStack_2068;
    auVar1 = vcmpps_avx(auVar7,auVar2,4);
    auVar81._16_8_ = uStack_2070;
    auVar81._0_16_ = auVar80;
    auVar81._24_8_ = uStack_2068;
    auVar2 = vcmpps_avx(*local_2458,auVar81,4);
    local_21e0 = auVar2._0_8_;
    uStack_21d8 = auVar2._8_8_;
    uStack_21d0 = auVar2._16_8_;
    uStack_21c8 = auVar2._24_8_;
    auVar7 = vpand_avx2(auVar1,auVar2);
    auVar21._16_8_ = uStack_2030;
    auVar21._0_16_ = auVar3;
    auVar21._24_8_ = uStack_2028;
    auVar8 = vpand_avx2(auVar21,auVar38);
    auVar20._16_8_ = uStack_2030;
    auVar20._0_16_ = auVar3;
    auVar20._24_8_ = uStack_2028;
    auVar9 = vpand_avx2(auVar20,*local_2458);
    auVar17._16_8_ = uStack_2070;
    auVar17._0_16_ = auVar80;
    auVar17._24_8_ = uStack_2068;
    auVar1 = vcmpps_avx(auVar39,auVar17,1);
    auVar81 = vcmpps_avx(*local_2458,auVar17,1);
    auVar19._16_8_ = uStack_2030;
    auVar19._0_16_ = auVar3;
    auVar19._24_8_ = uStack_2028;
    auVar81 = vpand_avx2(auVar81,auVar19);
    auVar24._16_8_ = uStack_1ff0;
    auVar24._0_16_ = auVar4;
    auVar24._24_8_ = uStack_1fe8;
    auVar81 = vpor_avx2(auVar81,auVar24);
    auVar1 = vpand_avx2(auVar1,auVar81);
    local_1860 = vdivps_avx(*local_2458,auVar40);
    local_17c4 = 0x80000000;
    local_17a0 = 0x80000000;
    auVar3 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x20);
    local_17c0 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x20);
    auStack_17b0 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x30);
    local_1880 = local_17c0._0_8_;
    uStack_1878 = local_17c0._8_8_;
    uStack_1870 = auStack_17b0._0_8_;
    uStack_1868 = auStack_17b0._8_8_;
    local_17c8 = 0x3f800000;
    local_1760 = 0x3f800000;
    auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
    local_1780 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
    auStack_1770 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
    local_18a0 = local_1780._0_8_;
    uStack_1898 = local_1780._8_8_;
    uStack_1890 = auStack_1770._0_8_;
    uStack_1888 = auStack_1770._8_8_;
    local_17cc = 0xbf800000;
    local_1720 = 0xbf800000;
    auVar3 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbf800000),0x20);
    local_1740 = vinsertps_avx(auVar3,ZEXT416(0xbf800000),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbf800000),0x20);
    auStack_1730 = vinsertps_avx(auVar3,ZEXT416(0xbf800000),0x30);
    local_18c0 = local_1740._0_8_;
    uStack_18b8 = local_1740._8_8_;
    uStack_18b0 = auStack_1730._0_8_;
    uStack_18a8 = auStack_1730._8_8_;
    local_17d0 = 0x3fc90fdb;
    local_16e0 = 0x3fc90fdb;
    auVar3 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x20);
    local_1700 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x20);
    auStack_16f0 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x30);
    local_18e0 = local_1700._0_8_;
    uStack_18d8 = local_1700._8_8_;
    uStack_18d0 = auStack_16f0._0_8_;
    uStack_18c8 = auStack_16f0._8_8_;
    local_17d4 = 0x3f800000;
    local_16a0 = 0x3f800000;
    auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
    local_16c0 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
    auStack_16b0 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
    local_1900 = local_16c0._0_8_;
    uStack_18f8 = local_16c0._8_8_;
    uStack_18f0 = auStack_16b0._0_8_;
    uStack_18e8 = auStack_16b0._8_8_;
    local_17d8 = 0xbeaaaa53;
    local_1660 = 0xbeaaaa53;
    auVar3 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbeaaaa53),0x20);
    local_1680 = vinsertps_avx(auVar3,ZEXT416(0xbeaaaa53),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbeaaaa53),0x20);
    auStack_1670 = vinsertps_avx(auVar3,ZEXT416(0xbeaaaa53),0x30);
    local_1920 = local_1680._0_8_;
    uStack_1918 = local_1680._8_8_;
    uStack_1910 = auStack_1670._0_8_;
    uStack_1908 = auStack_1670._8_8_;
    local_17dc = 0x3e4cb974;
    local_1620 = 0x3e4cb974;
    auVar3 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3e4cb974),0x20);
    local_1640 = vinsertps_avx(auVar3,ZEXT416(0x3e4cb974),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3e4cb974),0x20);
    auStack_1630 = vinsertps_avx(auVar3,ZEXT416(0x3e4cb974),0x30);
    local_1940 = local_1640._0_8_;
    uStack_1938 = local_1640._8_8_;
    uStack_1930 = auStack_1630._0_8_;
    uStack_1928 = auStack_1630._8_8_;
    local_17e0 = 0xbe117200;
    local_15e0 = 0xbe117200;
    auVar3 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbe117200),0x20);
    local_1600 = vinsertps_avx(auVar3,ZEXT416(0xbe117200),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbe117200),0x20);
    auStack_15f0 = vinsertps_avx(auVar3,ZEXT416(0xbe117200),0x30);
    local_1960 = local_1600._0_8_;
    uStack_1958 = local_1600._8_8_;
    uStack_1950 = auStack_15f0._0_8_;
    uStack_1948 = auStack_15f0._8_8_;
    local_17e4 = 0x3dd9ed24;
    local_15a0 = 0x3dd9ed24;
    auVar3 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3dd9ed24),0x20);
    local_15c0 = vinsertps_avx(auVar3,ZEXT416(0x3dd9ed24),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3dd9ed24),0x20);
    auStack_15b0 = vinsertps_avx(auVar3,ZEXT416(0x3dd9ed24),0x30);
    local_1980 = local_15c0._0_8_;
    uStack_1978 = local_15c0._8_8_;
    uStack_1970 = auStack_15b0._0_8_;
    uStack_1968 = auStack_15b0._8_8_;
    local_17e8 = 0xbd99b01e;
    local_1560 = 0xbd99b01e;
    auVar3 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbd99b01e),0x20);
    local_1580 = vinsertps_avx(auVar3,ZEXT416(0xbd99b01e),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbd99b01e),0x20);
    auStack_1570 = vinsertps_avx(auVar3,ZEXT416(0xbd99b01e),0x30);
    local_19a0 = local_1580._0_8_;
    uStack_1998 = local_1580._8_8_;
    uStack_1990 = auStack_1570._0_8_;
    uStack_1988 = auStack_1570._8_8_;
    local_17ec = 0x3d2edd4e;
    local_1520 = 0x3d2edd4e;
    auVar3 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3d2edd4e),0x20);
    local_1540 = vinsertps_avx(auVar3,ZEXT416(0x3d2edd4e),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3d2edd4e),0x20);
    auStack_1530 = vinsertps_avx(auVar3,ZEXT416(0x3d2edd4e),0x30);
    local_19c0 = local_1540._0_8_;
    uStack_19b8 = local_1540._8_8_;
    uStack_19b0 = auStack_1530._0_8_;
    uStack_19a8 = auStack_1530._8_8_;
    local_17f0 = 0xbc83a25c;
    local_14e0 = 0xbc83a25c;
    auVar3 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbc83a25c),0x20);
    local_1500 = vinsertps_avx(auVar3,ZEXT416(0xbc83a25c),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbc83a25c),0x20);
    auStack_14f0 = vinsertps_avx(auVar3,ZEXT416(0xbc83a25c),0x30);
    local_19e0 = local_1500._0_8_;
    uStack_19d8 = local_1500._8_8_;
    uStack_19d0 = auStack_14f0._0_8_;
    uStack_19c8 = auStack_14f0._8_8_;
    local_17f4 = 0x3b3ac537;
    local_14a0 = 0x3b3ac537;
    auVar3 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3b3ac537),0x20);
    local_14c0 = vinsertps_avx(auVar3,ZEXT416(0x3b3ac537),0x30);
    auVar3 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3b3ac537),0x20);
    auStack_14b0 = vinsertps_avx(auVar3,ZEXT416(0x3b3ac537),0x30);
    local_1a00 = local_14c0._0_8_;
    uStack_19f8 = local_14c0._8_8_;
    uStack_19f0 = auStack_14b0._0_8_;
    uStack_19e8 = auStack_14b0._8_8_;
    local_11e0 = local_17c0._0_8_;
    uStack_11d8 = local_17c0._8_8_;
    uStack_11d0 = auStack_17b0._0_8_;
    uStack_11c8 = auStack_17b0._8_8_;
    local_1200 = local_1860._0_8_;
    uStack_11f8 = local_1860._8_8_;
    uStack_11f0 = local_1860._16_8_;
    uStack_11e8 = local_1860._24_8_;
    auVar28._16_8_ = auStack_17b0._0_8_;
    auVar28._0_16_ = local_17c0;
    auVar28._24_8_ = auStack_17b0._8_8_;
    local_1a20 = vpand_avx2(auVar28,local_1860);
    local_d60 = local_17c0._0_8_;
    uStack_d58 = local_17c0._8_8_;
    uStack_d50 = auStack_17b0._0_8_;
    uStack_d48 = auStack_17b0._8_8_;
    local_d80 = local_1860._0_8_;
    uStack_d78 = local_1860._8_8_;
    uStack_d70 = local_1860._16_8_;
    uStack_d68 = local_1860._24_8_;
    auVar31._16_8_ = auStack_17b0._0_8_;
    auVar31._0_16_ = local_17c0;
    auVar31._24_8_ = auStack_17b0._8_8_;
    local_1a40 = vpandn_avx2(auVar31,local_1860);
    auVar25._16_8_ = auStack_1770._0_8_;
    auVar25._0_16_ = local_1780;
    auVar25._24_8_ = auStack_1770._8_8_;
    local_1a60 = vcmpps_avx(auVar25,local_1a40,1);
    local_1220 = local_1a60._0_8_;
    uStack_1218 = local_1a60._8_8_;
    uStack_1210 = local_1a60._16_8_;
    uStack_1208 = local_1a60._24_8_;
    local_1240 = local_1740._0_8_;
    uStack_1238 = local_1740._8_8_;
    uStack_1230 = auStack_1730._0_8_;
    uStack_1228 = auStack_1730._8_8_;
    auVar27._16_8_ = auStack_1730._0_8_;
    auVar27._0_16_ = local_1740;
    auVar27._24_8_ = auStack_1730._8_8_;
    local_e20 = vpand_avx2(local_1a60,auVar27);
    local_da0 = local_1a60._0_8_;
    uStack_d98 = local_1a60._8_8_;
    uStack_d90 = local_1a60._16_8_;
    uStack_d88 = local_1a60._24_8_;
    local_dc0 = local_1a40._0_8_;
    uStack_db8 = local_1a40._8_8_;
    uStack_db0 = local_1a40._16_8_;
    uStack_da8 = local_1a40._24_8_;
    local_e40 = vpandn_avx2(local_1a60,local_1a40);
    local_13a0 = vpor_avx2(local_e20,local_e40);
    local_1260 = local_1a60._0_8_;
    uStack_1258 = local_1a60._8_8_;
    uStack_1250 = local_1a60._16_8_;
    uStack_1248 = local_1a60._24_8_;
    local_1280 = local_1a40._0_8_;
    uStack_1278 = local_1a40._8_8_;
    uStack_1270 = local_1a40._16_8_;
    uStack_1268 = local_1a40._24_8_;
    local_e60 = vpand_avx2(local_1a60,local_1a40);
    local_de0 = local_1a60._0_8_;
    uStack_dd8 = local_1a60._8_8_;
    uStack_dd0 = local_1a60._16_8_;
    uStack_dc8 = local_1a60._24_8_;
    local_e00 = local_1780._0_8_;
    uStack_df8 = local_1780._8_8_;
    uStack_df0 = auStack_1770._0_8_;
    uStack_de8 = auStack_1770._8_8_;
    auVar30._16_8_ = auStack_1770._0_8_;
    auVar30._0_16_ = local_1780;
    auVar30._24_8_ = auStack_1770._8_8_;
    local_e80 = vpandn_avx2(local_1a60,auVar30);
    local_13c0 = vpor_avx2(local_e60,local_e80);
    local_1a80 = vdivps_avx(local_13a0,local_13c0);
    local_1400 = local_1a80._0_8_;
    uStack_13f8 = local_1a80._8_8_;
    uStack_13f0 = local_1a80._16_8_;
    uStack_13e8 = local_1a80._24_8_;
    local_13e0._0_4_ = local_1a80._0_4_;
    local_13e0._4_4_ = local_1a80._4_4_;
    uStack_13d8._0_4_ = local_1a80._8_4_;
    uStack_13d8._4_4_ = local_1a80._12_4_;
    uStack_13d0._0_4_ = local_1a80._16_4_;
    uStack_13d0._4_4_ = local_1a80._20_4_;
    uStack_13c8._0_4_ = local_1a80._24_4_;
    uStack_13c8._4_4_ = local_1a80._28_4_;
    fStack_1a84 = uStack_13c8._4_4_;
    local_1aa0 = (float)local_13e0 * (float)local_13e0;
    fStack_1a9c = local_13e0._4_4_ * local_13e0._4_4_;
    fStack_1a98 = (float)uStack_13d8 * (float)uStack_13d8;
    fStack_1a94 = uStack_13d8._4_4_ * uStack_13d8._4_4_;
    fStack_1a90 = (float)uStack_13d0 * (float)uStack_13d0;
    fStack_1a8c = uStack_13d0._4_4_ * uStack_13d0._4_4_;
    fStack_1a88 = (float)uStack_13c8 * (float)uStack_13c8;
    local_1440 = CONCAT44(fStack_1a9c,local_1aa0);
    uStack_1438 = CONCAT44(fStack_1a94,fStack_1a98);
    uStack_1430 = CONCAT44(fStack_1a8c,fStack_1a90);
    uStack_1428 = CONCAT44(uStack_13c8._4_4_,fStack_1a88);
    fStack_1aa4 = uStack_13c8._4_4_;
    local_1ac0 = local_1aa0 * local_1aa0;
    fStack_1abc = fStack_1a9c * fStack_1a9c;
    fStack_1ab8 = fStack_1a98 * fStack_1a98;
    fStack_1ab4 = fStack_1a94 * fStack_1a94;
    fStack_1ab0 = fStack_1a90 * fStack_1a90;
    fStack_1aac = fStack_1a8c * fStack_1a8c;
    fStack_1aa8 = fStack_1a88 * fStack_1a88;
    local_1358 = &local_1ac0;
    local_12d0 = &local_19e0;
    local_12d8 = &local_19a0;
    local_1180 = CONCAT44(fStack_1abc,local_1ac0);
    uStack_1178 = CONCAT44(fStack_1ab4,fStack_1ab8);
    uStack_1170 = CONCAT44(fStack_1aac,fStack_1ab0);
    uStack_1168 = CONCAT44(uStack_13c8._4_4_,fStack_1aa8);
    auVar45._4_4_ = fStack_1abc;
    auVar45._0_4_ = local_1ac0;
    auVar45._8_4_ = fStack_1ab8;
    auVar45._12_4_ = fStack_1ab4;
    auVar45._16_4_ = fStack_1ab0;
    auVar45._20_4_ = fStack_1aac;
    auVar45._24_4_ = fStack_1aa8;
    auVar45._28_4_ = uStack_13c8._4_4_;
    local_11a0 = local_1500._0_8_;
    uStack_1198 = local_1500._8_8_;
    uStack_1190 = auStack_14f0._0_8_;
    uStack_1188 = auStack_14f0._8_8_;
    auVar54._16_8_ = auStack_14f0._0_8_;
    auVar54._0_16_ = local_1500;
    auVar54._24_8_ = auStack_14f0._8_8_;
    local_11c0 = local_1580._0_8_;
    uStack_11b8 = local_1580._8_8_;
    uStack_11b0 = auStack_1570._0_8_;
    uStack_11a8 = auStack_1570._8_8_;
    auVar56._16_8_ = auStack_1570._0_8_;
    auVar56._0_16_ = local_1580;
    auVar56._24_8_ = auStack_1570._8_8_;
    auVar3 = vfmadd213ps_fma(auVar54,auVar45,auVar56);
    local_12e8 = local_1b40;
    local_12f0 = &local_1960;
    local_1120 = CONCAT44(fStack_1abc,local_1ac0);
    uStack_1118 = CONCAT44(fStack_1ab4,fStack_1ab8);
    uStack_1110 = CONCAT44(fStack_1aac,fStack_1ab0);
    uStack_1108 = CONCAT44(uStack_13c8._4_4_,fStack_1aa8);
    auVar46._4_4_ = fStack_1abc;
    auVar46._0_4_ = local_1ac0;
    auVar46._8_4_ = fStack_1ab8;
    auVar46._12_4_ = fStack_1ab4;
    auVar46._16_4_ = fStack_1ab0;
    auVar46._20_4_ = fStack_1aac;
    auVar46._24_4_ = fStack_1aa8;
    auVar46._28_4_ = uStack_13c8._4_4_;
    local_1b40._0_8_ = auVar3._0_8_;
    local_1140 = local_1b40._0_8_;
    local_1b40._8_8_ = auVar3._8_8_;
    uStack_1138 = local_1b40._8_8_;
    uStack_1130 = 0;
    uStack_1128 = 0;
    local_1160 = local_1600._0_8_;
    uStack_1158 = local_1600._8_8_;
    uStack_1150 = auStack_15f0._0_8_;
    uStack_1148 = auStack_15f0._8_8_;
    auVar58._16_8_ = auStack_15f0._0_8_;
    auVar58._0_16_ = local_1600;
    auVar58._24_8_ = auStack_15f0._8_8_;
    auVar6 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar46,auVar58);
    local_1300 = local_1b20;
    local_1308 = &local_1920;
    local_10c0 = CONCAT44(fStack_1abc,local_1ac0);
    uStack_10b8 = CONCAT44(fStack_1ab4,fStack_1ab8);
    uStack_10b0 = CONCAT44(fStack_1aac,fStack_1ab0);
    uStack_10a8 = CONCAT44(uStack_13c8._4_4_,fStack_1aa8);
    auVar47._4_4_ = fStack_1abc;
    auVar47._0_4_ = local_1ac0;
    auVar47._8_4_ = fStack_1ab8;
    auVar47._12_4_ = fStack_1ab4;
    auVar47._16_4_ = fStack_1ab0;
    auVar47._20_4_ = fStack_1aac;
    auVar47._24_4_ = fStack_1aa8;
    auVar47._28_4_ = uStack_13c8._4_4_;
    local_1b20._0_8_ = auVar6._0_8_;
    local_10e0 = local_1b20._0_8_;
    local_1b20._8_8_ = auVar6._8_8_;
    uStack_10d8 = local_1b20._8_8_;
    uStack_10d0 = 0;
    uStack_10c8 = 0;
    local_1100 = local_1680._0_8_;
    uStack_10f8 = local_1680._8_8_;
    uStack_10f0 = auStack_1670._0_8_;
    uStack_10e8 = auStack_1670._8_8_;
    auVar60._16_8_ = auStack_1670._0_8_;
    auVar60._0_16_ = local_1680;
    auVar60._24_8_ = auStack_1670._8_8_;
    auVar10 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar47,auVar60);
    local_1318 = &local_1a00;
    local_1320 = &local_19c0;
    local_1060 = CONCAT44(fStack_1abc,local_1ac0);
    uStack_1058 = CONCAT44(fStack_1ab4,fStack_1ab8);
    uStack_1050 = CONCAT44(fStack_1aac,fStack_1ab0);
    uStack_1048 = CONCAT44(uStack_13c8._4_4_,fStack_1aa8);
    auVar48._4_4_ = fStack_1abc;
    auVar48._0_4_ = local_1ac0;
    auVar48._8_4_ = fStack_1ab8;
    auVar48._12_4_ = fStack_1ab4;
    auVar48._16_4_ = fStack_1ab0;
    auVar48._20_4_ = fStack_1aac;
    auVar48._24_4_ = fStack_1aa8;
    auVar48._28_4_ = uStack_13c8._4_4_;
    local_1080 = local_14c0._0_8_;
    uStack_1078 = local_14c0._8_8_;
    uStack_1070 = auStack_14b0._0_8_;
    uStack_1068 = auStack_14b0._8_8_;
    auVar53._16_8_ = auStack_14b0._0_8_;
    auVar53._0_16_ = local_14c0;
    auVar53._24_8_ = auStack_14b0._8_8_;
    local_10a0 = local_1540._0_8_;
    uStack_1098 = local_1540._8_8_;
    uStack_1090 = auStack_1530._0_8_;
    uStack_1088 = auStack_1530._8_8_;
    auVar55._16_8_ = auStack_1530._0_8_;
    auVar55._0_16_ = local_1540;
    auVar55._24_8_ = auStack_1530._8_8_;
    auVar11 = vfmadd213ps_fma(auVar53,auVar48,auVar55);
    local_1330 = local_1bc0;
    local_1338 = &local_1980;
    local_1000 = CONCAT44(fStack_1abc,local_1ac0);
    uStack_ff8 = CONCAT44(fStack_1ab4,fStack_1ab8);
    uStack_ff0 = CONCAT44(fStack_1aac,fStack_1ab0);
    uStack_fe8 = CONCAT44(uStack_13c8._4_4_,fStack_1aa8);
    auVar49._4_4_ = fStack_1abc;
    auVar49._0_4_ = local_1ac0;
    auVar49._8_4_ = fStack_1ab8;
    auVar49._12_4_ = fStack_1ab4;
    auVar49._16_4_ = fStack_1ab0;
    auVar49._20_4_ = fStack_1aac;
    auVar49._24_4_ = fStack_1aa8;
    auVar49._28_4_ = uStack_13c8._4_4_;
    local_1bc0._0_8_ = auVar11._0_8_;
    local_1020 = local_1bc0._0_8_;
    local_1bc0._8_8_ = auVar11._8_8_;
    uStack_1018 = local_1bc0._8_8_;
    uStack_1010 = 0;
    uStack_1008 = 0;
    local_1040 = local_15c0._0_8_;
    uStack_1038 = local_15c0._8_8_;
    uStack_1030 = auStack_15b0._0_8_;
    uStack_1028 = auStack_15b0._8_8_;
    auVar57._16_8_ = auStack_15b0._0_8_;
    auVar57._0_16_ = local_15c0;
    auVar57._24_8_ = auStack_15b0._8_8_;
    auVar12 = vfmadd213ps_fma(ZEXT1632(auVar11),auVar49,auVar57);
    local_1348 = local_1ba0;
    local_1350 = &local_1940;
    local_fa0 = CONCAT44(fStack_1abc,local_1ac0);
    uStack_f98 = CONCAT44(fStack_1ab4,fStack_1ab8);
    uStack_f90 = CONCAT44(fStack_1aac,fStack_1ab0);
    uStack_f88 = CONCAT44(uStack_13c8._4_4_,fStack_1aa8);
    auVar50._4_4_ = fStack_1abc;
    auVar50._0_4_ = local_1ac0;
    auVar50._8_4_ = fStack_1ab8;
    auVar50._12_4_ = fStack_1ab4;
    auVar50._16_4_ = fStack_1ab0;
    auVar50._20_4_ = fStack_1aac;
    auVar50._24_4_ = fStack_1aa8;
    auVar50._28_4_ = uStack_13c8._4_4_;
    local_1ba0._0_8_ = auVar12._0_8_;
    local_fc0 = local_1ba0._0_8_;
    local_1ba0._8_8_ = auVar12._8_8_;
    uStack_fb8 = local_1ba0._8_8_;
    uStack_fb0 = 0;
    uStack_fa8 = 0;
    local_fe0 = local_1640._0_8_;
    uStack_fd8 = local_1640._8_8_;
    uStack_fd0 = auStack_1630._0_8_;
    uStack_fc8 = auStack_1630._8_8_;
    auVar59._16_8_ = auStack_1630._0_8_;
    auVar59._0_16_ = local_1640;
    auVar59._24_8_ = auStack_1630._8_8_;
    auVar13 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar50,auVar59);
    local_1360 = local_1b80;
    local_1368 = &local_1900;
    local_f40 = CONCAT44(fStack_1abc,local_1ac0);
    uStack_f38 = CONCAT44(fStack_1ab4,fStack_1ab8);
    uStack_f30 = CONCAT44(fStack_1aac,fStack_1ab0);
    uStack_f28 = CONCAT44(uStack_13c8._4_4_,fStack_1aa8);
    auVar51._4_4_ = fStack_1abc;
    auVar51._0_4_ = local_1ac0;
    auVar51._8_4_ = fStack_1ab8;
    auVar51._12_4_ = fStack_1ab4;
    auVar51._16_4_ = fStack_1ab0;
    auVar51._20_4_ = fStack_1aac;
    auVar51._24_4_ = fStack_1aa8;
    auVar51._28_4_ = uStack_13c8._4_4_;
    local_1b80._0_8_ = auVar13._0_8_;
    local_f60 = local_1b80._0_8_;
    local_1b80._8_8_ = auVar13._8_8_;
    uStack_f58 = local_1b80._8_8_;
    uStack_f50 = 0;
    uStack_f48 = 0;
    local_f80 = local_16c0._0_8_;
    uStack_f78 = local_16c0._8_8_;
    uStack_f70 = auStack_16b0._0_8_;
    uStack_f68 = auStack_16b0._8_8_;
    auVar61._16_8_ = auStack_16b0._0_8_;
    auVar61._0_16_ = local_16c0;
    auVar61._24_8_ = auStack_16b0._8_8_;
    auVar14 = vfmadd213ps_fma(ZEXT1632(auVar13),auVar51,auVar61);
    local_1370 = &local_1aa0;
    local_1378 = local_1b00;
    local_1380 = local_1b60;
    local_ee0 = CONCAT44(fStack_1a9c,local_1aa0);
    uStack_ed8 = CONCAT44(fStack_1a94,fStack_1a98);
    uStack_ed0 = CONCAT44(fStack_1a8c,fStack_1a90);
    uStack_ec8 = CONCAT44(uStack_13c8._4_4_,fStack_1a88);
    auVar52._4_4_ = fStack_1a9c;
    auVar52._0_4_ = local_1aa0;
    auVar52._8_4_ = fStack_1a98;
    auVar52._12_4_ = fStack_1a94;
    auVar52._16_4_ = fStack_1a90;
    auVar52._20_4_ = fStack_1a8c;
    auVar52._24_4_ = fStack_1a88;
    auVar52._28_4_ = uStack_13c8._4_4_;
    local_1b00._0_8_ = auVar10._0_8_;
    local_f00 = local_1b00._0_8_;
    local_1b00._8_8_ = auVar10._8_8_;
    uStack_ef8 = local_1b00._8_8_;
    uStack_ef0 = 0;
    uStack_ee8 = 0;
    local_1b60._0_8_ = auVar14._0_8_;
    local_f20 = local_1b60._0_8_;
    local_1b60._8_8_ = auVar14._8_8_;
    uStack_f18 = local_1b60._8_8_;
    uStack_f10 = 0;
    uStack_f08 = 0;
    auVar15 = vfmadd213ps_fma(ZEXT1632(auVar10),auVar52,ZEXT1632(auVar14));
    local_1ae0._0_8_ = auVar15._0_8_;
    uVar83 = local_1ae0._0_8_;
    local_1ae0._8_8_ = auVar15._8_8_;
    uVar84 = local_1ae0._8_8_;
    uStack_1450 = 0;
    uStack_1448 = 0;
    local_1480 = local_1a80._0_8_;
    uStack_1478 = local_1a80._8_8_;
    uStack_1470 = local_1a80._16_8_;
    uStack_1468 = local_1a80._24_8_;
    local_1460._0_4_ = auVar15._0_4_;
    local_1460._4_4_ = auVar15._4_4_;
    uStack_1458._0_4_ = auVar15._8_4_;
    uStack_1458._4_4_ = auVar15._12_4_;
    fStack_1804 = uStack_13c8._4_4_;
    local_1820 = (float)local_1460 * (float)local_13e0;
    fStack_181c = local_1460._4_4_ * local_13e0._4_4_;
    fStack_1818 = (float)uStack_1458 * (float)uStack_13d8;
    fStack_1814 = uStack_1458._4_4_ * uStack_13d8._4_4_;
    fStack_1810 = (float)uStack_13d0 * 0.0;
    fStack_180c = uStack_13d0._4_4_ * 0.0;
    fStack_1808 = (float)uStack_13c8 * 0.0;
    local_12a0 = local_1a60._0_8_;
    uStack_1298 = local_1a60._8_8_;
    uStack_1290 = local_1a60._16_8_;
    uStack_1288 = local_1a60._24_8_;
    local_12c0 = local_1700._0_8_;
    uStack_12b8 = local_1700._8_8_;
    uStack_12b0 = auStack_16f0._0_8_;
    uStack_12a8 = auStack_16f0._8_8_;
    auVar26._16_8_ = auStack_16f0._0_8_;
    auVar26._0_16_ = local_1700;
    auVar26._24_8_ = auStack_16f0._8_8_;
    _local_1840 = vpand_avx2(local_1a60,auVar26);
    local_ea0 = local_1820 + (float)local_1840._0_4_;
    fStack_e9c = fStack_181c + (float)local_1840._4_4_;
    fStack_e98 = fStack_1818 + fStack_1838;
    fStack_e94 = fStack_1814 + fStack_1834;
    fStack_e90 = fStack_1810 + fStack_1830;
    fStack_e8c = fStack_180c + fStack_182c;
    fStack_e88 = fStack_1808 + fStack_1828;
    fStack_e84 = uStack_13c8._4_4_ + fStack_1824;
    local_ec0 = local_1a20._0_8_;
    uStack_eb8 = local_1a20._8_8_;
    uStack_eb0 = local_1a20._16_8_;
    uStack_ea8 = local_1a20._24_8_;
    auVar29._4_4_ = fStack_e9c;
    auVar29._0_4_ = local_ea0;
    auVar29._8_4_ = fStack_e98;
    auVar29._12_4_ = fStack_e94;
    auVar29._16_4_ = fStack_e90;
    auVar29._20_4_ = fStack_e8c;
    auVar29._24_4_ = fStack_e88;
    auVar29._28_4_ = fStack_e84;
    auVar81 = vpor_avx2(auVar29,local_1a20);
    local_20c0 = auVar81._0_4_;
    fStack_20bc = auVar81._4_4_;
    fStack_20b8 = auVar81._8_4_;
    fStack_20b4 = auVar81._12_4_;
    fStack_20b0 = auVar81._16_4_;
    fStack_20ac = auVar81._20_4_;
    fStack_20a8 = auVar81._24_4_;
    fStack_20a4 = auVar81._28_4_;
    local_20e0 = auVar1._0_4_;
    fStack_20dc = auVar1._4_4_;
    fStack_20d8 = auVar1._8_4_;
    fStack_20d4 = auVar1._12_4_;
    fStack_20d0 = auVar1._16_4_;
    fStack_20cc = auVar1._20_4_;
    fStack_20c8 = auVar1._24_4_;
    fStack_20c4 = auVar1._28_4_;
    auVar23._16_8_ = uStack_1ff0;
    auVar23._0_16_ = auVar4;
    auVar23._24_8_ = uStack_1fe8;
    auVar1 = vpor_avx2(auVar8,auVar23);
    auVar8._16_8_ = uStack_2070;
    auVar8._0_16_ = auVar80;
    auVar8._24_8_ = uStack_2068;
    auVar1 = vcmpps_avx(auVar1,auVar8,1);
    auVar22._16_8_ = uStack_1fb0;
    auVar22._0_16_ = auVar5;
    auVar22._24_8_ = uStack_1fa8;
    auVar81 = vpor_avx2(auVar9,auVar22);
    auVar81 = vpand_avx2(auVar2,auVar81);
    local_ce0 = local_21e0;
    uStack_cd8 = uStack_21d8;
    uStack_cd0 = uStack_21d0;
    uStack_cc8 = uStack_21c8;
    local_22a0 = auVar1._0_8_;
    uStack_2298 = auVar1._8_8_;
    uStack_2290 = auVar1._16_8_;
    uStack_2288 = auVar1._24_8_;
    auVar18._16_8_ = uStack_1ff0;
    auVar18._0_16_ = auVar4;
    auVar18._24_8_ = uStack_1fe8;
    auVar8 = vpand_avx2(auVar1,auVar18);
    local_ca0 = local_22a0;
    uStack_c98 = uStack_2298;
    uStack_c90 = uStack_2290;
    uStack_c88 = uStack_2288;
    local_cc0 = local_2080;
    uStack_cb8 = uStack_2078;
    uStack_cb0 = uStack_2070;
    uStack_ca8 = uStack_2068;
    auVar32._16_8_ = uStack_2070;
    auVar32._0_16_ = auVar80;
    auVar32._24_8_ = uStack_2068;
    auVar1 = vpandn_avx2(auVar1,auVar32);
    local_d00 = vpor_avx2(auVar8,auVar1);
    auVar1 = vpandn_avx2(auVar2,local_d00);
    auVar2 = vpor_avx2(auVar81,auVar1);
    local_2200 = auVar7._0_8_;
    uStack_21f8 = auVar7._8_8_;
    uStack_21f0 = auVar7._16_8_;
    uStack_21e8 = auVar7._24_8_;
    auVar9._4_4_ = fStack_20bc + fStack_20dc;
    auVar9._0_4_ = local_20c0 + local_20e0;
    auVar9._12_4_ = fStack_20b4 + fStack_20d4;
    auVar9._8_4_ = fStack_20b8 + fStack_20d8;
    auVar9._20_4_ = fStack_20ac + fStack_20cc;
    auVar9._16_4_ = fStack_20b0 + fStack_20d0;
    auVar9._28_4_ = fStack_20a4 + fStack_20c4;
    auVar9._24_4_ = fStack_20a8 + fStack_20c8;
    auVar1 = vpand_avx2(auVar7,auVar9);
    local_d20 = local_2200;
    uStack_d18 = uStack_21f8;
    uStack_d10 = uStack_21f0;
    uStack_d08 = uStack_21e8;
    local_22c0 = auVar2._0_8_;
    local_d40 = local_22c0;
    uStack_22b8 = auVar2._8_8_;
    uStack_d38 = uStack_22b8;
    uStack_22b0 = auVar2._16_8_;
    uStack_d30 = uStack_22b0;
    uStack_22a8 = auVar2._24_8_;
    uStack_d28 = uStack_22a8;
    auVar81 = vpternlogq_avx512vl(auVar7,auVar7,auVar7,0xf);
    auVar2 = vpand_avx2(auVar81,auVar2);
    auVar1 = vpor_avx2(auVar1,auVar2);
    local_25c0 = auVar1._0_8_;
    uStackY_25b8 = auVar1._8_8_;
    uStackY_25b0 = auVar1._16_8_;
    uStackY_25a8 = auVar1._24_8_;
    *(undefined8 *)*local_2468 = local_25c0;
    *(undefined8 *)(*local_2468 + 8) = uStackY_25b8;
    *(undefined8 *)(*local_2468 + 0x10) = uStackY_25b0;
    *(undefined8 *)(*local_2468 + 0x18) = uStackY_25a8;
    local_2458 = local_2458 + 1;
    local_2468 = (undefined1 (*) [64])(*local_2468 + 0x20);
    local_1bc0 = ZEXT1632(auVar11);
    local_1ba0 = ZEXT1632(auVar12);
    local_1b80 = ZEXT1632(auVar13);
    local_1b60 = ZEXT1632(auVar14);
    local_1b40 = ZEXT1632(auVar3);
    local_1b20 = ZEXT1632(auVar6);
    local_1b00 = ZEXT1632(auVar10);
    local_1ae0 = ZEXT1632(auVar15);
    local_179c = local_17a0;
    local_1798 = local_17a0;
    local_1794 = local_17a0;
    local_1790 = local_17a0;
    local_178c = local_17a0;
    local_1788 = local_17a0;
    local_1784 = local_17a0;
    local_175c = local_1760;
    local_1758 = local_1760;
    local_1754 = local_1760;
    local_1750 = local_1760;
    local_174c = local_1760;
    local_1748 = local_1760;
    local_1744 = local_1760;
    local_171c = local_1720;
    local_1718 = local_1720;
    local_1714 = local_1720;
    local_1710 = local_1720;
    local_170c = local_1720;
    local_1708 = local_1720;
    local_1704 = local_1720;
    local_16dc = local_16e0;
    local_16d8 = local_16e0;
    local_16d4 = local_16e0;
    local_16d0 = local_16e0;
    local_16cc = local_16e0;
    local_16c8 = local_16e0;
    local_16c4 = local_16e0;
    local_169c = local_16a0;
    local_1698 = local_16a0;
    local_1694 = local_16a0;
    local_1690 = local_16a0;
    local_168c = local_16a0;
    local_1688 = local_16a0;
    local_1684 = local_16a0;
    local_165c = local_1660;
    local_1658 = local_1660;
    local_1654 = local_1660;
    local_1650 = local_1660;
    local_164c = local_1660;
    local_1648 = local_1660;
    local_1644 = local_1660;
    local_161c = local_1620;
    local_1618 = local_1620;
    local_1614 = local_1620;
    local_1610 = local_1620;
    local_160c = local_1620;
    local_1608 = local_1620;
    local_1604 = local_1620;
    local_15dc = local_15e0;
    local_15d8 = local_15e0;
    local_15d4 = local_15e0;
    local_15d0 = local_15e0;
    local_15cc = local_15e0;
    local_15c8 = local_15e0;
    local_15c4 = local_15e0;
    local_159c = local_15a0;
    local_1598 = local_15a0;
    local_1594 = local_15a0;
    local_1590 = local_15a0;
    local_158c = local_15a0;
    local_1588 = local_15a0;
    local_1584 = local_15a0;
    local_155c = local_1560;
    local_1558 = local_1560;
    local_1554 = local_1560;
    local_1550 = local_1560;
    local_154c = local_1560;
    local_1548 = local_1560;
    local_1544 = local_1560;
    local_151c = local_1520;
    local_1518 = local_1520;
    local_1514 = local_1520;
    local_1510 = local_1520;
    local_150c = local_1520;
    local_1508 = local_1520;
    local_1504 = local_1520;
    local_14dc = local_14e0;
    local_14d8 = local_14e0;
    local_14d4 = local_14e0;
    local_14d0 = local_14e0;
    local_14cc = local_14e0;
    local_14c8 = local_14e0;
    local_14c4 = local_14e0;
    local_149c = local_14a0;
    local_1498 = local_14a0;
    local_1494 = local_14a0;
    local_1490 = local_14a0;
    local_148c = local_14a0;
    local_1488 = local_14a0;
    local_1484 = local_14a0;
    local_1460 = uVar83;
    uStack_1458 = uVar84;
    local_1420 = local_1440;
    uStack_1418 = uStack_1438;
    uStack_1410 = uStack_1430;
    uStack_1408 = uStack_1428;
    local_13e0 = local_1400;
    uStack_13d8 = uStack_13f8;
    uStack_13d0 = uStack_13f0;
    uStack_13c8 = uStack_13e8;
    local_1340 = local_1358;
    local_1328 = local_1358;
    local_1310 = local_1358;
    local_12f8 = local_1358;
    local_12e0 = local_1358;
    local_12c8 = local_1358;
  }
  for (; local_247c + 3 < in_ECX; local_247c = local_247c + 4) {
    local_ba0 = *(undefined8 *)*local_2458;
    uStack_b98 = *(undefined8 *)(*local_2458 + 8);
    local_bb0 = local_25f0;
    uStack_ba8 = uStackY_25e8;
    auVar44._8_8_ = uStackY_25e8;
    auVar44._0_8_ = local_25f0;
    auVar43._8_8_ = uStackY_25e8;
    auVar43._0_8_ = local_25f0;
    auVar42._8_8_ = uStackY_25e8;
    auVar42._0_8_ = local_25f0;
    auVar41._8_8_ = uStackY_25e8;
    auVar41._0_8_ = local_25f0;
    local_8c4 = 0;
    local_8a4 = 0;
    local_8c0 = 0;
    local_bc0 = 0;
    uStack_bb8 = 0;
    local_8e4 = 0x80000000;
    local_8c8 = 0x80000000;
    local_8e0 = 0x80000000;
    local_bd0 = 0x8000000080000000;
    uStack_bc8 = 0x8000000080000000;
    local_904 = 0x40490fdb;
    local_8e8 = 0x40490fdb;
    local_900 = 0x40490fdb;
    local_be0 = 0x40490fdb40490fdb;
    uStack_bd8 = 0x40490fdb40490fdb;
    local_924 = 0x3fc90fdb;
    local_908 = 0x3fc90fdb;
    local_920 = 0x3fc90fdb;
    local_bf0 = 0x3fc90fdb3fc90fdb;
    uStack_be8 = 0x3fc90fdb3fc90fdb;
    local_c00 = vcmpps_avx(auVar41,ZEXT816(0),4);
    local_c10 = vcmpps_avx(*(undefined1 (*) [16])*local_2458,ZEXT816(0),4);
    local_a60 = local_c00._0_8_;
    uStack_a58 = local_c00._8_8_;
    local_a70 = local_c10._0_8_;
    uStack_a68 = local_c10._8_8_;
    local_c20 = vpand_avx(local_c00,local_c10);
    auVar6._8_8_ = 0x8000000080000000;
    auVar6._0_8_ = 0x8000000080000000;
    local_c30 = vpand_avx(auVar6,auVar42);
    auVar5._8_8_ = 0x8000000080000000;
    auVar5._0_8_ = 0x8000000080000000;
    local_c40 = vpand_avx(auVar5,*(undefined1 (*) [16])*local_2458);
    local_ae0 = vcmpps_avx(auVar43,ZEXT816(0),1);
    local_ac0 = vcmpps_avx(*(undefined1 (*) [16])*local_2458,ZEXT816(0),1);
    auVar4._8_8_ = 0x8000000080000000;
    auVar4._0_8_ = 0x8000000080000000;
    local_9a0 = vpand_avx(local_ac0,auVar4);
    auVar12._8_8_ = 0x40490fdb40490fdb;
    auVar12._0_8_ = 0x40490fdb40490fdb;
    local_af0 = vpor_avx(local_9a0,auVar12);
    local_c50 = vpand_avx(local_ae0,local_af0);
    local_6b0 = vdivps_avx(*(undefined1 (*) [16])*local_2458,auVar44);
    local_134 = 0x80000000;
    local_114 = 0x80000000;
    local_130 = 0x80000000;
    local_6c0 = 0x8000000080000000;
    uStack_6b8 = 0x8000000080000000;
    local_154 = 0x3f800000;
    local_138 = 0x3f800000;
    local_150 = 0x3f800000;
    local_6d0 = 0x3f8000003f800000;
    uStack_6c8 = 0x3f8000003f800000;
    local_174 = 0xbf800000;
    local_158 = 0xbf800000;
    local_170 = 0xbf800000;
    local_6e0 = 0xbf800000bf800000;
    uStack_6d8 = 0xbf800000bf800000;
    local_194 = 0x3fc90fdb;
    local_178 = 0x3fc90fdb;
    local_190 = 0x3fc90fdb;
    local_6f0 = 0x3fc90fdb3fc90fdb;
    uStack_6e8 = 0x3fc90fdb3fc90fdb;
    local_1b4 = 0x3f800000;
    local_198 = 0x3f800000;
    local_1b0 = 0x3f800000;
    local_700 = 0x3f8000003f800000;
    uStack_6f8 = 0x3f8000003f800000;
    local_1d4 = 0xbeaaaa53;
    local_1b8 = 0xbeaaaa53;
    local_1d0 = 0xbeaaaa53;
    local_710 = 0xbeaaaa53beaaaa53;
    uStack_708 = 0xbeaaaa53beaaaa53;
    local_1f4 = 0x3e4cb974;
    local_1d8 = 0x3e4cb974;
    local_1f0 = 0x3e4cb974;
    local_720 = 0x3e4cb9743e4cb974;
    uStack_718 = 0x3e4cb9743e4cb974;
    local_214 = 0xbe117200;
    local_1f8 = 0xbe117200;
    local_210 = 0xbe117200;
    local_730 = 0xbe117200be117200;
    uStack_728 = 0xbe117200be117200;
    local_234 = 0x3dd9ed24;
    local_218 = 0x3dd9ed24;
    local_230 = 0x3dd9ed24;
    local_740 = 0x3dd9ed243dd9ed24;
    uStack_738 = 0x3dd9ed243dd9ed24;
    local_254 = 0xbd99b01e;
    local_238 = 0xbd99b01e;
    local_250 = 0xbd99b01e;
    local_750 = 0xbd99b01ebd99b01e;
    uStack_748 = 0xbd99b01ebd99b01e;
    local_274 = 0x3d2edd4e;
    local_258 = 0x3d2edd4e;
    local_270 = 0x3d2edd4e;
    local_760 = 0x3d2edd4e3d2edd4e;
    uStack_758 = 0x3d2edd4e3d2edd4e;
    local_294 = 0xbc83a25c;
    local_278 = 0xbc83a25c;
    local_290 = 0xbc83a25c;
    local_770 = 0xbc83a25cbc83a25c;
    uStack_768 = 0xbc83a25cbc83a25c;
    local_2b4 = 0x3b3ac537;
    local_298 = 0x3b3ac537;
    local_2b0 = 0x3b3ac537;
    local_780 = 0x3b3ac5373b3ac537;
    uStack_778 = 0x3b3ac5373b3ac537;
    local_5a0 = local_6b0._0_8_;
    uStack_598 = local_6b0._8_8_;
    auVar15._8_8_ = 0x8000000080000000;
    auVar15._0_8_ = 0x8000000080000000;
    local_790 = vpand_avx(auVar15,local_6b0);
    local_d0 = local_6b0._0_8_;
    uStack_c8 = local_6b0._8_8_;
    auVar36._8_8_ = 0x8000000080000000;
    auVar36._0_8_ = 0x8000000080000000;
    local_7a0 = vpandn_avx(auVar36,local_6b0);
    local_2e0 = local_7a0._0_8_;
    uStack_2d8 = local_7a0._8_8_;
    auVar34._8_8_ = 0x3f8000003f800000;
    auVar34._0_8_ = 0x3f8000003f800000;
    local_7b0 = vcmpps_avx(auVar34,local_7a0,1);
    local_5b0 = local_7b0._0_8_;
    uStack_5a8 = local_7b0._8_8_;
    auVar14._8_8_ = 0xbf800000bf800000;
    auVar14._0_8_ = 0xbf800000bf800000;
    local_2f0 = vpand_avx(local_7b0,auVar14);
    local_e0 = local_7b0._0_8_;
    uStack_d8 = local_7b0._8_8_;
    local_f0 = local_7a0._0_8_;
    uStack_e8 = local_7a0._8_8_;
    local_300 = vpandn_avx(local_7b0,local_7a0);
    local_610 = vpor_avx(local_2f0,local_300);
    local_5d0 = local_7b0._0_8_;
    uStack_5c8 = local_7b0._8_8_;
    local_5e0 = local_7a0._0_8_;
    uStack_5d8 = local_7a0._8_8_;
    local_310 = vpand_avx(local_7b0,local_7a0);
    local_100 = local_7b0._0_8_;
    uStack_f8 = local_7b0._8_8_;
    auVar35._8_8_ = 0x3f8000003f800000;
    auVar35._0_8_ = 0x3f8000003f800000;
    local_320 = vpandn_avx(local_7b0,auVar35);
    local_620 = vpor_avx(local_310,local_320);
    local_7c0 = vdivps_avx(local_610,local_620);
    local_640 = local_7c0._0_8_;
    uStack_638 = local_7c0._8_8_;
    local_630._0_4_ = local_7c0._0_4_;
    local_630._4_4_ = local_7c0._4_4_;
    uStack_628._0_4_ = local_7c0._8_4_;
    uStack_628._4_4_ = local_7c0._12_4_;
    local_7d0 = (float)local_630 * (float)local_630;
    fStack_7cc = local_630._4_4_ * local_630._4_4_;
    fStack_7c8 = (float)uStack_628 * (float)uStack_628;
    fStack_7c4 = uStack_628._4_4_ * uStack_628._4_4_;
    local_660 = CONCAT44(fStack_7cc,local_7d0);
    uStack_658 = CONCAT44(fStack_7c4,fStack_7c8);
    local_7e0 = local_7d0 * local_7d0;
    fStack_7dc = fStack_7cc * fStack_7cc;
    fStack_7d8 = fStack_7c8 * fStack_7c8;
    fStack_7d4 = fStack_7c4 * fStack_7c4;
    local_558 = &local_7e0;
    local_4d0 = &local_770;
    local_4d8 = &local_750;
    local_4a0 = CONCAT44(fStack_7dc,local_7e0);
    uStack_498 = CONCAT44(fStack_7d4,fStack_7d8);
    auVar62._4_4_ = fStack_7dc;
    auVar62._0_4_ = local_7e0;
    auVar62._8_4_ = fStack_7d8;
    auVar62._12_4_ = fStack_7d4;
    local_4b0 = 0xbc83a25cbc83a25c;
    uStack_4a8 = 0xbc83a25cbc83a25c;
    auVar71._8_8_ = 0xbc83a25cbc83a25c;
    auVar71._0_8_ = 0xbc83a25cbc83a25c;
    local_4c0 = 0xbd99b01ebd99b01e;
    uStack_4b8 = 0xbd99b01ebd99b01e;
    auVar73._8_8_ = 0xbd99b01ebd99b01e;
    auVar73._0_8_ = 0xbd99b01ebd99b01e;
    local_820 = vfmadd213ps_fma(auVar71,auVar62,auVar73);
    local_4e8 = local_820;
    local_4f0 = &local_730;
    local_470 = CONCAT44(fStack_7dc,local_7e0);
    uStack_468 = CONCAT44(fStack_7d4,fStack_7d8);
    auVar63._4_4_ = fStack_7dc;
    auVar63._0_4_ = local_7e0;
    auVar63._8_4_ = fStack_7d8;
    auVar63._12_4_ = fStack_7d4;
    local_480 = local_820._0_8_;
    uStack_478 = local_820._8_8_;
    local_490 = 0xbe117200be117200;
    uStack_488 = 0xbe117200be117200;
    auVar75._8_8_ = 0xbe117200be117200;
    auVar75._0_8_ = 0xbe117200be117200;
    local_810 = vfmadd213ps_fma(local_820,auVar63,auVar75);
    local_500 = local_810;
    local_508 = &local_710;
    local_440 = CONCAT44(fStack_7dc,local_7e0);
    uStack_438 = CONCAT44(fStack_7d4,fStack_7d8);
    auVar64._4_4_ = fStack_7dc;
    auVar64._0_4_ = local_7e0;
    auVar64._8_4_ = fStack_7d8;
    auVar64._12_4_ = fStack_7d4;
    local_450 = local_810._0_8_;
    uStack_448 = local_810._8_8_;
    local_460 = 0xbeaaaa53beaaaa53;
    uStack_458 = 0xbeaaaa53beaaaa53;
    auVar77._8_8_ = 0xbeaaaa53beaaaa53;
    auVar77._0_8_ = 0xbeaaaa53beaaaa53;
    local_800 = vfmadd213ps_fma(local_810,auVar64,auVar77);
    local_518 = &local_780;
    local_520 = &local_760;
    local_410 = CONCAT44(fStack_7dc,local_7e0);
    uStack_408 = CONCAT44(fStack_7d4,fStack_7d8);
    auVar65._4_4_ = fStack_7dc;
    auVar65._0_4_ = local_7e0;
    auVar65._8_4_ = fStack_7d8;
    auVar65._12_4_ = fStack_7d4;
    local_420 = 0x3b3ac5373b3ac537;
    uStack_418 = 0x3b3ac5373b3ac537;
    auVar70._8_8_ = 0x3b3ac5373b3ac537;
    auVar70._0_8_ = 0x3b3ac5373b3ac537;
    local_430 = 0x3d2edd4e3d2edd4e;
    uStack_428 = 0x3d2edd4e3d2edd4e;
    auVar72._8_8_ = 0x3d2edd4e3d2edd4e;
    auVar72._0_8_ = 0x3d2edd4e3d2edd4e;
    local_860 = vfmadd213ps_fma(auVar70,auVar65,auVar72);
    local_530 = local_860;
    local_538 = &local_740;
    local_3e0 = CONCAT44(fStack_7dc,local_7e0);
    uStack_3d8 = CONCAT44(fStack_7d4,fStack_7d8);
    auVar66._4_4_ = fStack_7dc;
    auVar66._0_4_ = local_7e0;
    auVar66._8_4_ = fStack_7d8;
    auVar66._12_4_ = fStack_7d4;
    local_3f0 = local_860._0_8_;
    uStack_3e8 = local_860._8_8_;
    local_400 = 0x3dd9ed243dd9ed24;
    uStack_3f8 = 0x3dd9ed243dd9ed24;
    auVar74._8_8_ = 0x3dd9ed243dd9ed24;
    auVar74._0_8_ = 0x3dd9ed243dd9ed24;
    local_850 = vfmadd213ps_fma(local_860,auVar66,auVar74);
    local_548 = local_850;
    local_550 = &local_720;
    local_3b0 = CONCAT44(fStack_7dc,local_7e0);
    uStack_3a8 = CONCAT44(fStack_7d4,fStack_7d8);
    auVar67._4_4_ = fStack_7dc;
    auVar67._0_4_ = local_7e0;
    auVar67._8_4_ = fStack_7d8;
    auVar67._12_4_ = fStack_7d4;
    local_3c0 = local_850._0_8_;
    uStack_3b8 = local_850._8_8_;
    local_3d0 = 0x3e4cb9743e4cb974;
    uStack_3c8 = 0x3e4cb9743e4cb974;
    auVar76._8_8_ = 0x3e4cb9743e4cb974;
    auVar76._0_8_ = 0x3e4cb9743e4cb974;
    local_840 = vfmadd213ps_fma(local_850,auVar67,auVar76);
    local_560 = local_840;
    local_568 = &local_700;
    local_380 = CONCAT44(fStack_7dc,local_7e0);
    uStack_378 = CONCAT44(fStack_7d4,fStack_7d8);
    auVar68._4_4_ = fStack_7dc;
    auVar68._0_4_ = local_7e0;
    auVar68._8_4_ = fStack_7d8;
    auVar68._12_4_ = fStack_7d4;
    local_390 = local_840._0_8_;
    uStack_388 = local_840._8_8_;
    local_3a0 = 0x3f8000003f800000;
    uStack_398 = 0x3f8000003f800000;
    auVar78._8_8_ = 0x3f8000003f800000;
    auVar78._0_8_ = 0x3f8000003f800000;
    local_830 = vfmadd213ps_fma(local_840,auVar68,auVar78);
    local_570 = &local_7d0;
    local_578 = local_800;
    local_580 = local_830;
    local_350 = CONCAT44(fStack_7cc,local_7d0);
    uStack_348 = CONCAT44(fStack_7c4,fStack_7c8);
    auVar69._4_4_ = fStack_7cc;
    auVar69._0_4_ = local_7d0;
    auVar69._8_4_ = fStack_7c8;
    auVar69._12_4_ = fStack_7c4;
    local_360 = local_800._0_8_;
    uStack_358 = local_800._8_8_;
    local_370 = local_830._0_8_;
    uStack_368 = local_830._8_8_;
    local_7f0 = vfmadd213ps_fma(local_800,auVar69,local_830);
    local_680 = local_7c0._0_8_;
    uStack_678 = local_7c0._8_8_;
    local_670._0_4_ = local_7f0._0_4_;
    local_670._4_4_ = local_7f0._4_4_;
    uStack_668._0_4_ = local_7f0._8_4_;
    uStack_668._4_4_ = local_7f0._12_4_;
    local_690 = (float)local_670 * (float)local_630;
    fStack_68c = local_670._4_4_ * local_630._4_4_;
    fStack_688 = (float)uStack_668 * (float)uStack_628;
    fStack_684 = uStack_668._4_4_ * uStack_628._4_4_;
    local_5f0 = local_7b0._0_8_;
    uStack_5e8 = local_7b0._8_8_;
    auVar13._8_8_ = 0x3fc90fdb3fc90fdb;
    auVar13._0_8_ = 0x3fc90fdb3fc90fdb;
    _local_6a0 = vpand_avx(local_7b0,auVar13);
    local_330 = local_690 + (float)local_6a0._0_4_;
    fStack_32c = fStack_68c + (float)local_6a0._4_4_;
    fStack_328 = fStack_688 + fStack_698;
    fStack_324 = fStack_684 + fStack_694;
    local_340 = local_790._0_8_;
    uStack_338 = local_790._8_8_;
    auVar33._4_4_ = fStack_32c;
    auVar33._0_4_ = local_330;
    auVar33._8_4_ = fStack_328;
    auVar33._12_4_ = fStack_324;
    _local_b80 = vpor_avx(auVar33,local_790);
    local_b90._0_4_ = local_c50._0_4_;
    local_b90._4_4_ = local_c50._4_4_;
    uStack_b88._0_4_ = local_c50._8_4_;
    uStack_b88._4_4_ = local_c50._12_4_;
    local_c60 = (float)local_b80._0_4_ + (float)local_b90;
    fStack_c5c = (float)local_b80._4_4_ + local_b90._4_4_;
    fStack_c58 = fStack_b78 + (float)uStack_b88;
    fStack_c54 = fStack_b74 + uStack_b88._4_4_;
    local_9c0 = local_c30._0_8_;
    uStack_9b8 = local_c30._8_8_;
    auVar11._8_8_ = 0x40490fdb40490fdb;
    auVar11._0_8_ = 0x40490fdb40490fdb;
    local_980 = vpor_avx(local_c30,auVar11);
    local_c70 = vcmpps_avx(local_980,ZEXT816(0),1);
    local_b00 = local_c10._0_8_;
    uStack_af8 = local_c10._8_8_;
    local_9e0 = local_c40._0_8_;
    uStack_9d8 = local_c40._8_8_;
    auVar10._8_8_ = 0x3fc90fdb3fc90fdb;
    auVar10._0_8_ = 0x3fc90fdb3fc90fdb;
    local_b10 = vpor_avx(local_c40,auVar10);
    local_a20 = vpand_avx(local_c10,local_b10);
    local_80 = local_c10._0_8_;
    uStack_78 = local_c10._8_8_;
    local_b20 = local_c70._0_8_;
    uStack_b18 = local_c70._8_8_;
    auVar3._8_8_ = 0x40490fdb40490fdb;
    auVar3._0_8_ = 0x40490fdb40490fdb;
    local_a00 = vpand_avx(local_c70,auVar3);
    local_60 = local_c70._0_8_;
    uStack_58 = local_c70._8_8_;
    local_a10 = vpandn_avx(local_c70,ZEXT816(0));
    local_90 = vpor_avx(local_a00,local_a10);
    local_a30 = vpandn_avx(local_c10,local_90);
    local_c80 = vpor_avx(local_a20,local_a30);
    local_b40 = local_c20._0_8_;
    uStack_b38 = local_c20._8_8_;
    local_b50 = CONCAT44(fStack_c5c,local_c60);
    uStack_b48 = CONCAT44(fStack_c54,fStack_c58);
    auVar80._8_8_ = uStack_b48;
    auVar80._0_8_ = local_b50;
    local_a40 = vpand_avx(local_c20,auVar80);
    local_a0 = local_c20._0_8_;
    uStack_98 = local_c20._8_8_;
    local_b0 = local_c80._0_8_;
    uStack_a8 = local_c80._8_8_;
    auVar80 = vpternlogq_avx512vl(local_c20,local_c20,local_c20,0xf);
    local_a50 = vpand_avx(auVar80,local_c80);
    auVar80 = vpor_avx(local_a40,local_a50);
    local_25e0 = auVar80._0_8_;
    uStackY_25d8 = auVar80._8_8_;
    *(undefined8 *)*local_2468 = local_25e0;
    *(undefined8 *)(*local_2468 + 8) = uStackY_25d8;
    local_2458 = (undefined1 (*) [32])(*local_2458 + 0x10);
    local_2468 = (undefined1 (*) [64])(*local_2468 + 0x10);
    local_b90 = local_c50._0_8_;
    uStack_b88 = local_c50._8_8_;
    local_b70 = local_bb0;
    uStack_b68 = uStack_ba8;
    local_b60 = local_ba0;
    uStack_b58 = uStack_b98;
    local_b30 = local_be0;
    uStack_b28 = uStack_bd8;
    local_ad0 = local_bd0;
    uStack_ac8 = uStack_bc8;
    local_ab0 = local_ba0;
    uStack_aa8 = uStack_b98;
    local_aa0 = local_bd0;
    uStack_a98 = uStack_bc8;
    local_a90 = local_bb0;
    uStack_a88 = uStack_ba8;
    local_a80 = local_bd0;
    uStack_a78 = uStack_bc8;
    local_9f0 = local_bf0;
    uStack_9e8 = uStack_be8;
    local_9d0 = local_be0;
    uStack_9c8 = uStack_bd8;
    local_9b0 = local_be0;
    uStack_9a8 = uStack_bd8;
    local_990 = local_bc0;
    uStack_988 = uStack_bb8;
    local_970 = local_bc0;
    uStack_968 = uStack_bb8;
    local_960 = local_ba0;
    uStack_958 = uStack_b98;
    local_950 = local_bc0;
    uStack_948 = uStack_bb8;
    local_940 = local_bb0;
    uStack_938 = uStack_ba8;
    uStack_91c = local_920;
    uStack_918 = local_920;
    uStack_914 = local_920;
    uStack_8fc = local_900;
    uStack_8f8 = local_900;
    uStack_8f4 = local_900;
    uStack_8dc = local_8e0;
    uStack_8d8 = local_8e0;
    uStack_8d4 = local_8e0;
    uStack_8bc = local_8c0;
    uStack_8b8 = local_8c0;
    uStack_8b4 = local_8c0;
    local_8a0 = local_bc0;
    uStack_898 = uStack_bb8;
    local_890 = local_ba0;
    uStack_888 = uStack_b98;
    local_880 = local_bc0;
    uStack_878 = uStack_bb8;
    local_870 = local_bb0;
    uStack_868 = uStack_ba8;
    local_670 = local_7f0._0_8_;
    uStack_668 = local_7f0._8_8_;
    local_650 = local_660;
    uStack_648 = uStack_658;
    local_630 = local_640;
    uStack_628 = uStack_638;
    local_600 = local_6f0;
    uStack_5f8 = uStack_6e8;
    local_5c0 = local_6e0;
    uStack_5b8 = uStack_6d8;
    local_590 = local_6c0;
    uStack_588 = uStack_6b8;
    local_540 = local_558;
    local_528 = local_558;
    local_510 = local_558;
    local_4f8 = local_558;
    local_4e0 = local_558;
    local_4c8 = local_558;
    local_2d0 = local_6d0;
    uStack_2c8 = uStack_6c8;
    uStack_2ac = local_2b0;
    uStack_2a8 = local_2b0;
    uStack_2a4 = local_2b0;
    uStack_28c = local_290;
    uStack_288 = local_290;
    uStack_284 = local_290;
    uStack_26c = local_270;
    uStack_268 = local_270;
    uStack_264 = local_270;
    uStack_24c = local_250;
    uStack_248 = local_250;
    uStack_244 = local_250;
    uStack_22c = local_230;
    uStack_228 = local_230;
    uStack_224 = local_230;
    uStack_20c = local_210;
    uStack_208 = local_210;
    uStack_204 = local_210;
    uStack_1ec = local_1f0;
    uStack_1e8 = local_1f0;
    uStack_1e4 = local_1f0;
    uStack_1cc = local_1d0;
    uStack_1c8 = local_1d0;
    uStack_1c4 = local_1d0;
    uStack_1ac = local_1b0;
    uStack_1a8 = local_1b0;
    uStack_1a4 = local_1b0;
    uStack_18c = local_190;
    uStack_188 = local_190;
    uStack_184 = local_190;
    uStack_16c = local_170;
    uStack_168 = local_170;
    uStack_164 = local_170;
    uStack_14c = local_150;
    uStack_148 = local_150;
    uStack_144 = local_150;
    uStack_12c = local_130;
    uStack_128 = local_130;
    uStack_124 = local_130;
    local_110 = local_6d0;
    uStack_108 = uStack_6c8;
    local_c0 = local_6c0;
    uStack_b8 = uStack_6b8;
    local_70 = local_bc0;
    uStack_68 = uStack_bb8;
  }
  for (; local_247c < in_ECX; local_247c = local_247c + 1) {
    fVar82 = atan2f(*(float *)*local_2458,__x);
    *(float *)*local_2468 = fVar82;
    local_2458 = (undefined1 (*) [32])(*local_2458 + 4);
    local_2468 = (undefined1 (*) [64])(*local_2468 + 4);
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_b(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float b = *ptr1;

    int i = 0;
#if __SSE2__
    __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps(ptr1) : _mm_set1_ps(b);
#if __AVX__
    __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps(ptr1) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
    __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps(ptr1) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_256);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b_128);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, b);
        ptr += 1;
        outptr += 1;
    }
}